

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

string * __thiscall
notch::core::LogisticActivation::tag_abi_cxx11_
          (string *__return_storage_ptr__,LogisticActivation *this)

{
  ostream *poVar1;
  ostringstream out;
  ostringstream local_190 [376];
  
  ::std::__cxx11::ostringstream::ostringstream(local_190);
  ::std::operator<<((ostream *)local_190,"logistic");
  if ((this->slope != 1.0) || (NAN(this->slope))) {
    poVar1 = ::std::operator<<((ostream *)local_190,"(");
    poVar1 = (ostream *)::std::ostream::operator<<(poVar1,this->slope);
    ::std::operator<<(poVar1,")");
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string tag() const {
        std::ostringstream out;
        out << "logistic";
        if (slope != 1.0) {
            out << "(" << slope << ")";
        }
        return out.str();
    }